

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3ExprGlobalHitsCb(Fts3Expr *pExpr,int iPhrase,void *pCtx)

{
  u8 uVar1;
  undefined4 uVar2;
  Fts3Cursor *pCsr;
  sqlite3_vtab *psVar3;
  sqlite3_int64 sVar4;
  int iVar5;
  Fts3Expr *pExpr_00;
  u32 *puVar6;
  undefined4 *puVar7;
  Fts3Expr *pFVar8;
  long lVar9;
  long lVar10;
  Fts3Expr *pFVar11;
  bool bVar12;
  int local_58;
  u8 local_51;
  sqlite3_int64 local_50;
  sqlite3_int64 local_48;
  long local_40;
  long local_38;
  
  pCsr = *pCtx;
  local_38 = *(long *)((long)pCtx + 0x18);
  local_40 = (long)(iPhrase * *(int *)((long)pCtx + 8) * 3);
  psVar3 = (pCsr->base).pVtab;
  if ((pExpr->bDeferred == '\0') || (pExpr->pParent->eType == 1)) {
    local_58 = 0;
    if (pExpr->aMI == (u32 *)0x0) {
      local_50 = pCsr->iPrevId;
      pFVar11 = pExpr;
      do {
        pExpr_00 = pFVar11;
        pFVar11 = pExpr_00->pParent;
        if (pFVar11 == (Fts3Expr *)0x0) break;
      } while (pFVar11->eType == 1);
      local_48 = pExpr_00->iDocid;
      local_51 = pExpr_00->bEof;
      pFVar11 = pExpr_00;
      do {
        pFVar8 = pFVar11;
        if (pFVar11->eType != 5) {
          pFVar8 = pFVar11->pRight;
        }
        puVar6 = (u32 *)sqlite3_malloc(*(int *)&psVar3[2].pModule * 0xc);
        pFVar8->aMI = puVar6;
        if (puVar6 == (u32 *)0x0) {
          return 7;
        }
        memset(puVar6,0,(long)*(int *)&psVar3[2].pModule * 0xc);
        pFVar11 = pFVar11->pLeft;
      } while (pFVar11 != (Fts3Expr *)0x0);
      fts3EvalRestart(pCsr,pExpr_00,&local_58);
      sVar4 = local_48;
      if (local_58 == 0 && pCsr->isEof == '\0') {
LAB_00187da2:
        do {
          if (pCsr->isRequireSeek == '\0') {
            sqlite3_reset(pCsr->pStmt);
          }
          fts3EvalNextRow(pCsr,pExpr_00,&local_58);
          uVar1 = pExpr_00->bEof;
          pCsr->isEof = uVar1;
          pCsr->isRequireSeek = '\x01';
          pCsr->isMatchinfoNeeded = 1;
          pCsr->iPrevId = pExpr_00->iDocid;
          if (uVar1 != '\0') break;
          if (pExpr_00->eType == 1) {
            iVar5 = fts3EvalTestDeferredAndNear(pCsr,&local_58);
            if (iVar5 != 0) goto LAB_00187da2;
            bVar12 = pCsr->isEof != '\0';
          }
          else {
            bVar12 = false;
          }
          if ((((local_58 != 0) || (bVar12)) ||
              (fts3EvalUpdateCounts(pExpr_00), pCsr->isEof != '\0')) || (local_58 != 0)) break;
        } while( true );
      }
      pCsr->isEof = '\0';
      pCsr->iPrevId = local_50;
      if (local_51 == '\0') {
        fts3EvalRestart(pCsr,pExpr_00,&local_58);
        do {
          fts3EvalNextRow(pCsr,pExpr_00,&local_58);
          if (pExpr_00->iDocid == sVar4) break;
        } while (local_58 == 0);
        fts3EvalTestDeferredAndNear(pCsr,&local_58);
      }
      else {
        pExpr_00->bEof = local_51;
      }
      if (local_58 != 0) {
        return local_58;
      }
    }
    if (0 < *(int *)&psVar3[2].pModule) {
      local_38 = local_38 + local_40 * 4;
      puVar6 = pExpr->aMI;
      lVar9 = 8;
      lVar10 = 0;
      do {
        *(undefined4 *)(local_38 + -4 + lVar9) = *(undefined4 *)((long)puVar6 + lVar9 + -4);
        *(undefined4 *)(local_38 + lVar9) = *(undefined4 *)((long)puVar6 + lVar9);
        lVar10 = lVar10 + 1;
        lVar9 = lVar9 + 0xc;
      } while (lVar10 < *(int *)&psVar3[2].pModule);
      return 0;
    }
  }
  else if (0 < *(int *)&psVar3[2].pModule) {
    uVar2 = (undefined4)pCsr->nDoc;
    puVar7 = (undefined4 *)(local_38 + local_40 * 4 + 8);
    lVar9 = 0;
    do {
      puVar7[-1] = uVar2;
      *puVar7 = uVar2;
      lVar9 = lVar9 + 1;
      puVar7 = puVar7 + 3;
    } while (lVar9 < *(int *)&psVar3[2].pModule);
    return 0;
  }
  return 0;
}

Assistant:

static int fts3ExprGlobalHitsCb(
  Fts3Expr *pExpr,                /* Phrase expression node */
  int iPhrase,                    /* Phrase number (numbered from zero) */
  void *pCtx                      /* Pointer to MatchInfo structure */
){
  MatchInfo *p = (MatchInfo *)pCtx;
  return sqlite3Fts3EvalPhraseStats(
      p->pCursor, pExpr, &p->aMatchinfo[3*iPhrase*p->nCol]
  );
}